

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

bool __thiscall
tinyusdz::Animatable<tinyusdz::value::color3d>::get
          (Animatable<tinyusdz::value::color3d> *this,double t,color3d *v,
          TimeSampleInterpolationType tinerp)

{
  double dVar1;
  bool bVar2;
  
  if ((v == (color3d *)0x0) || (this->_blocked != false)) {
LAB_00535be3:
    bVar2 = false;
  }
  else {
    if ((!NAN(t)) || (this->_has_value != true)) {
      if ((this->_ts)._dirty == true) {
        TypedTimeSamples<tinyusdz::value::color3d>::update(&this->_ts);
      }
      if ((this->_ts)._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3d>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->_ts)._samples.
          super__Vector_base<tinyusdz::TypedTimeSamples<tinyusdz::value::color3d>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<tinyusdz::value::color3d>::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        bVar2 = TypedTimeSamples<tinyusdz::value::color3d>::get<tinyusdz::value::color3d,_nullptr>
                          (&this->_ts,v,t,tinerp);
        return bVar2;
      }
      if ((this->_has_value != true) || (this->_blocked != false)) goto LAB_00535be3;
    }
    v->b = (this->_value).b;
    dVar1 = (this->_value).g;
    v->r = (this->_value).r;
    v->g = dVar1;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool get(double t, T *v,
           const value::TimeSampleInterpolationType tinerp =
               value::TimeSampleInterpolationType::Linear) const {
    if (!v) {
      return false;
    }

    if (is_blocked()) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {
      if (has_value()) {
        (*v) = _value;
        return true;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinerp);
    }
    
    if (has_default()) {
      return get_scalar(v);
    }

    return false;
  }